

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConnectCommand.cpp
# Opt level: O0

void __thiscall ConnectCommand::ConnectCommand(ConnectCommand *this)

{
  int iVar1;
  ostream *this_00;
  ConnectCommand *this_local;
  
  Command::Command(&this->super_Command);
  (this->super_Command)._vptr_Command = (_func_int **)&PTR_execute_0012dd48;
  std::__cxx11::string::string((string *)&this->host_address);
  iVar1 = socket(2,1,0);
  this->client_socket = iVar1;
  if (this->client_socket == -1) {
    this_00 = std::operator<<((ostream *)&std::cerr,"could not create a socket");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
  }
  return;
}

Assistant:

ConnectCommand::ConnectCommand() {
  this->client_socket = socket(AF_INET, SOCK_STREAM, 0);
  if (client_socket == -1) {
    cerr << "could not create a socket" << endl;
  }
}